

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiffReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::TextDiffReporter::report(TextDiffReporter *this,string *received,string *approved)

{
  uint uVar1;
  ostream *poVar2;
  pointer pRVar3;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  bool result;
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  
  poVar2 = ::std::operator<<(*(ostream **)(in_RDI + 0x10),"Comparing files:");
  ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
  poVar2 = ::std::operator<<(*(ostream **)(in_RDI + 0x10),"received: ");
  poVar2 = ::std::operator<<(poVar2,in_RSI);
  ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
  poVar2 = ::std::operator<<(*(ostream **)(in_RDI + 0x10),"approved: ");
  poVar2 = ::std::operator<<(poVar2,in_RDX);
  ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
  pRVar3 = ::std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
           ::operator->((unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
                         *)0x1fd126);
  ::std::__cxx11::string::string(local_40,in_RSI);
  ::std::__cxx11::string::string(local_60,in_RDX);
  uVar1 = (*pRVar3->_vptr_Reporter[2])(pRVar3,local_40,local_60);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_40);
  local_19 = (byte)uVar1 & 1;
  if ((uVar1 & 1) == 0) {
    ::std::operator<<(*(ostream **)(in_RDI + 0x10),
                      "TextDiffReporter did not find a working diff program\n\n");
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool TextDiffReporter::report(std::string received, std::string approved) const
    {
        stream_ << "Comparing files:" << std::endl;
        stream_ << "received: " << received << std::endl;
        stream_ << "approved: " << approved << std::endl;
        const bool result = m_reporter->report(received, approved);
        if (!result)
        {
            stream_ << "TextDiffReporter did not find a working diff "
                       "program\n\n";
        }

        return result;
    }